

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::getTessellationEvaluationShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest2 *this,_shader_stage *referencing_stage)

{
  ostream *poVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result;
  ostream local_198;
  _shader_stage *local_20;
  _shader_stage *referencing_stage_local;
  NegativeTest2 *this_local;
  
  local_20 = referencing_stage;
  referencing_stage_local = (_shader_stage *)this;
  this_local = (NegativeTest2 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(quads) in;\n\nsubroutine void testSubroutineType(out vec4 test_argument);\n\nsubroutine(testSubroutineType) void te_subroutine(out vec4 test_argument)\n{\n    test_argument = vec4(1, 1, 1, 1);\n}\n\nsubroutine uniform testSubroutineType test_te_subroutine;\n\nvoid main()\n{\n    "
                          );
  getSubroutineUniformName_abi_cxx11_(&local_1d8,this,local_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  std::operator<<(poVar1,"(gl_Position);\n}\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest2::getTessellationEvaluationShaderBody(const Utils::_shader_stage& referencing_stage) const
{
	std::stringstream result;

	/* Form the pre-amble */
	result << "#version 400\n"
			  "\n"
			  "#extension GL_ARB_shader_subroutine : require\n"
			  "\n"
			  "layout(quads) in;\n"
			  "\n"
			  "subroutine void testSubroutineType(out vec4 test_argument);\n"
			  "\n"
			  /* Define a subroutine */
			  "subroutine(testSubroutineType) void te_subroutine(out vec4 test_argument)\n"
			  "{\n"
			  "    test_argument = vec4(1, 1, 1, 1);\n"
			  "}\n"
			  "\n"
			  /* Define uniforms */
			  "subroutine uniform testSubroutineType test_te_subroutine;\n"
			  "\n"
			  /* Define main() */
			  "void main()\n"
			  "{\n"
			  "    "
		   << getSubroutineUniformName(referencing_stage) << "(gl_Position);\n"
															 "}\n";

	return result.str();
}